

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<long_double,_signed_char>::Run
          (DataTransform<long_double,_signed_char> *this,istream *input_stream)

{
  char cVar1;
  int iVar2;
  NumericType NVar3;
  WarningType WVar4;
  bool bVar5;
  char *__nptr;
  bool bVar6;
  int *piVar7;
  undefined8 uVar8;
  ostream *poVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  longdouble in_ST0;
  longdouble lVar14;
  longdouble lVar15;
  longdouble lVar16;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  string word;
  char buffer [128];
  char local_28a;
  char local_288;
  char local_282;
  string local_280;
  string *local_260;
  long local_258;
  ulong local_250;
  longdouble local_248;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_260 = &this->print_format_;
  iVar13 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        bVar5 = true;
        bVar6 = false;
        lVar14 = in_ST0;
      }
      else {
        piVar7 = __errno_location();
        iVar2 = *piVar7;
        *piVar7 = 0;
        strtold(__nptr,(char **)&local_280);
        if (local_280._M_dataplus._M_p == __nptr) {
          uVar8 = std::__throw_invalid_argument("stold");
LAB_00144f4f:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar8);
        }
        if (*piVar7 == 0) {
          *piVar7 = iVar2;
        }
        else if (*piVar7 == 0x22) {
          uVar8 = std::__throw_out_of_range("stold");
          goto LAB_00144f4f;
        }
        bVar5 = false;
        bVar6 = true;
        lVar14 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_248 = in_ST0;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      in_ST0 = lVar14;
      if (bVar6) goto LAB_00144b9c;
      if (bVar5) {
        if (bVar5) {
LAB_00144efb:
          bVar6 = true;
          if ((this->is_ascii_output_ == true) && (iVar13 % this->num_column_ != 0)) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
            std::ostream::put(-0x78);
            std::ostream::flush();
          }
        }
        else {
LAB_00144f39:
          bVar6 = false;
        }
        return bVar6;
      }
    }
    else {
      bVar6 = sptk::ReadStream<long_double>(&local_248,input_stream);
      if (!bVar6) goto LAB_00144efb;
LAB_00144b9c:
      local_282 = (char)(short)ROUND(local_248);
      local_28a = this->minimum_value_;
      cVar1 = this->maximum_value_;
      lVar14 = in_ST0;
      if (local_28a < cVar1) {
        NVar3 = this->input_numeric_type_;
        if (NVar3 == kFloatingPoint) {
          in_ST6 = in_ST5;
          if (((longdouble)(short)local_28a <= local_248) &&
             (local_28a = cVar1, local_248 <= (longdouble)(short)cVar1)) goto LAB_00144ccd;
        }
        else {
          uVar11 = (ulong)cVar1;
          if (NVar3 == kUnsignedInteger) {
            lVar15 = (longdouble)9.223372e+18;
            lVar16 = (longdouble)0;
            if (lVar15 <= local_248) {
              lVar16 = lVar15;
            }
            local_250 = (ulong)ROUND(local_248 - lVar16);
            uVar12 = (ulong)(lVar15 <= local_248) << 0x3f ^ local_250;
            in_ST5 = in_ST4;
            in_ST6 = in_ST4;
            if ((ulong)(long)local_28a <= uVar12) {
              bVar6 = uVar11 < uVar12;
              local_28a = local_282;
              if (bVar6) {
                local_28a = cVar1;
              }
              goto LAB_00144cd1;
            }
          }
          else {
            if (NVar3 != kSignedInteger) goto LAB_00144ccd;
            local_258 = (long)ROUND(local_248);
            in_ST6 = in_ST5;
            if (local_28a <= local_258) {
              bVar6 = (long)uVar11 < local_258;
              local_28a = local_282;
              if ((long)uVar11 < local_258) {
                local_28a = cVar1;
              }
              goto LAB_00144cd1;
            }
          }
        }
LAB_00144d24:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"th data is over the range of output type",0x28);
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"x2x","");
          sptk::PrintErrorMessage(&local_280,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p);
          }
          WVar4 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          lVar14 = in_ST0;
          if (WVar4 == kExit) goto LAB_00144f39;
        }
      }
      else {
LAB_00144ccd:
        bVar6 = false;
        local_28a = local_282;
LAB_00144cd1:
        if ((bVar6) || (this->rounding_ == false)) {
          if (bVar6) goto LAB_00144d24;
        }
        else {
          in_ST6 = in_ST5;
          if (local_248 <= (longdouble)0) {
            local_288 = (char)(short)ROUND(local_248 + (longdouble)-0.5);
            local_28a = local_288;
          }
          else {
            local_28a = (char)(short)ROUND(local_248 + (longdouble)0.5);
          }
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar6 = sptk::SnPrintf<signed_char>(local_28a,local_260,0x80,local_b8);
        if (!bVar6) goto LAB_00144f39;
        sVar10 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar10);
        if ((iVar13 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          in_ST7 = in_ST6;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
          in_ST7 = in_ST6;
        }
      }
      else {
        bVar6 = sptk::WriteStream<signed_char>(local_28a,(ostream *)&std::cout);
        in_ST7 = in_ST6;
        if (!bVar6) goto LAB_00144f39;
      }
    }
    iVar13 = iVar13 + 1;
    in_ST0 = lVar14;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }